

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

void __thiscall mjs::array_object::put_length(array_object *this,value *v)

{
  uint32_t uVar1;
  gc_heap *h;
  global_object *g;
  uint32_t extraout_EDX;
  undefined4 extraout_EDX_00;
  uint32_t extraout_EDX_01;
  undefined4 extraout_var;
  double n;
  wstring local_50;
  undefined8 local_30;
  undefined8 local_28;
  uint local_20;
  uint32_t local_1c;
  uint32_t l;
  uint32_t old_length;
  value *v_local;
  array_object *this_local;
  
  local_1c = this->length_;
  _l = v;
  v_local = (value *)this;
  h = object::heap((object *)this);
  g = gc_heap_ptr_untracked<mjs::global_object,_true>::dereference
                ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
                 &(this->super_native_object).field_0x24,h);
  n = to_number(_l);
  uVar1 = anon_unknown_63::check_array_length(g,n);
  this->length_ = uVar1;
  uVar1 = extraout_EDX;
  for (local_20 = this->length_; local_20 < local_1c; local_20 = local_20 + 1) {
    index_string_abi_cxx11_(&local_50,(mjs *)(ulong)local_20,uVar1);
    local_30 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_50);
    local_28 = CONCAT44(extraout_var,extraout_EDX_00);
    (*(this->super_native_object).super_object._vptr_object[2])(this,&local_30);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
    uVar1 = extraout_EDX_01;
  }
  return;
}

Assistant:

void put_length(const value& v) {
        // ES3, 15.4.5.1
        const auto old_length = length_;
        length_ = check_array_length(global_.dereference(heap()), to_number(v));
        for (auto l = length_; l < old_length; ++l) {
            delete_property(index_string(l));
        }
    }